

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O3

vector<CAddress,_std::allocator<CAddress>_> *
ReadAnchors(vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,
           path *anchors_db_path)

{
  pointer *ppbVar1;
  long lVar2;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  FILE *file;
  CChainParams *pCVar3;
  runtime_error *this;
  size_t in_RCX;
  size_t __nbytes;
  code *pcVar4;
  pointer_____offset_0x10___ *ppuVar5;
  long in_FS_OFFSET;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  string_view logging_function;
  string_view source_file;
  void *pvVar8;
  long lVar9;
  MessageStartChars pchMsgTmp;
  AutoFile filein;
  uint256 local_e8;
  uint256 hashTmp;
  HashVerifier<AutoFile> verifier;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  file = fsbridge::fopen((char *)anchors_db_path,"rb");
  pvVar8 = (void *)0x0;
  lVar9 = 0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&filein,(FILE *)file,data_xor);
  if (pvVar8 != (void *)0x0) {
    operator_delete(pvVar8,lVar9 - (long)pvVar8);
  }
  if (filein.m_file == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this = &PTR__exception_00afe8f0;
    pcVar4 = std::exception::~exception;
    ppuVar5 = &(anonymous_namespace)::DbNotFoundError::typeinfo;
  }
  else {
    CSHA256::CSHA256((CSHA256 *)&verifier);
    verifier.m_source = &filein;
    AutoFile::read(&filein,(int)&pchMsgTmp,(void *)0x4,in_RCX);
    CSHA256::Write((CSHA256 *)&verifier,pchMsgTmp._M_elems,4);
    pCVar3 = Params();
    __nbytes = (size_t)(uint)pchMsgTmp._M_elems;
    if (pchMsgTmp._M_elems == *&(pCVar3->pchMessageStart)._M_elems) {
      hashTmp.super_base_blob<256U>.m_data._M_elems._8_8_ = &verifier;
      hashTmp.super_base_blob<256U>.m_data._M_elems._0_8_ = &CAddress::V2_DISK;
      VectorFormatter<DefaultFormatter>::
      Unser<ParamsStream<HashVerifier<AutoFile>&,CAddress::SerParams>,std::vector<CAddress,std::allocator<CAddress>>>
                ((VectorFormatter<DefaultFormatter> *)&local_e8,
                 (ParamsStream<HashVerifier<AutoFile>_&,_CAddress::SerParams> *)&hashTmp,
                 __return_storage_ptr__);
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      AutoFile::read(&filein,(int)(_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                                   *)&hashTmp,(void *)0x20,__nbytes);
      HashWriter::GetHash(&local_e8,&verifier.super_HashWriter);
      auVar7[0] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x10] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar7[1] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x11] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar7[2] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x12] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar7[3] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x13] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar7[4] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x14] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar7[5] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x15] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar7[6] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x16] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar7[7] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x17] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar7[8] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x18] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar7[9] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x19] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar7[10] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar7[0xb] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar7[0xc] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar7[0xd] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar7[0xe] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar7[0xf] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar6[0] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[0]);
      auVar6[1] = -(local_e8.super_base_blob<256U>.m_data._M_elems[1] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[1]);
      auVar6[2] = -(local_e8.super_base_blob<256U>.m_data._M_elems[2] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[2]);
      auVar6[3] = -(local_e8.super_base_blob<256U>.m_data._M_elems[3] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[3]);
      auVar6[4] = -(local_e8.super_base_blob<256U>.m_data._M_elems[4] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[4]);
      auVar6[5] = -(local_e8.super_base_blob<256U>.m_data._M_elems[5] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[5]);
      auVar6[6] = -(local_e8.super_base_blob<256U>.m_data._M_elems[6] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[6]);
      auVar6[7] = -(local_e8.super_base_blob<256U>.m_data._M_elems[7] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[7]);
      auVar6[8] = -(local_e8.super_base_blob<256U>.m_data._M_elems[8] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[8]);
      auVar6[9] = -(local_e8.super_base_blob<256U>.m_data._M_elems[9] ==
                   hashTmp.super_base_blob<256U>.m_data._M_elems[9]);
      auVar6[10] = -(local_e8.super_base_blob<256U>.m_data._M_elems[10] ==
                    hashTmp.super_base_blob<256U>.m_data._M_elems[10]);
      auVar6[0xb] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xb] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar6[0xc] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xc] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar6[0xd] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xd] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar6[0xe] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xe] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar6[0xf] = -(local_e8.super_base_blob<256U>.m_data._M_elems[0xf] ==
                     hashTmp.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar6 = auVar6 & auVar7;
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
        AutoFile::~AutoFile(&filein);
        local_e8.super_base_blob<256U>.m_data._M_elems._0_8_ =
             ((long)(__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        fs::path::filename((path *)&verifier,anchors_db_path);
        ppbVar1 = &filein.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        filein.m_file = (FILE *)ppbVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&filein,verifier.super_HashWriter.ctx.s._0_8_,
                   verifier.super_HashWriter.ctx.s._8_8_ + verifier.super_HashWriter.ctx.s._0_8_);
        hashTmp.super_base_blob<256U>.m_data._M_elems[8] = '\"';
        hashTmp.super_base_blob<256U>.m_data._M_elems[9] = '&';
        hashTmp.super_base_blob<256U>.m_data._M_elems._0_8_ = &filein;
        logging_function._M_str = "ReadAnchors";
        logging_function._M_len = 0xb;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
        ;
        source_file._M_len = 0x5a;
        LogPrintFormatInternal<unsigned_long,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                  (logging_function,source_file,0xea,ALL,Info,(ConstevalFormatString<2U>)0x8146d3,
                   (unsigned_long *)&local_e8,
                   (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                    *)&hashTmp);
        if (filein.m_file != (FILE *)ppbVar1) {
          operator_delete(filein.m_file,
                          (ulong)(filein.m_xor.
                                  super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                  super__Vector_impl_data._M_finish + 1));
        }
        std::filesystem::__cxx11::path::~path((path *)&verifier);
        std::filesystem::remove(&anchors_db_path->super_path);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          return __return_storage_ptr__;
        }
        goto LAB_004354a9;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Checksum mismatch, data corrupted");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid network magic number");
    }
    pcVar4 = std::runtime_error::~runtime_error;
    ppuVar5 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    __cxa_throw(this,ppuVar5,pcVar4);
  }
LAB_004354a9:
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> ReadAnchors(const fs::path& anchors_db_path)
{
    std::vector<CAddress> anchors;
    try {
        DeserializeFileDB(anchors_db_path, CAddress::V2_DISK(anchors));
        LogPrintf("Loaded %i addresses from %s\n", anchors.size(), fs::quoted(fs::PathToString(anchors_db_path.filename())));
    } catch (const std::exception&) {
        anchors.clear();
    }

    fs::remove(anchors_db_path);
    return anchors;
}